

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

int proxy_load_conf(proxy_handle *ph,char *path)

{
  char *__s1;
  int iVar1;
  int iVar2;
  
  iVar1 = conf_parse_file(path,&ph->conf,(log_handle *)((long)ph->priv + 0x860));
  if (-1 < iVar1) {
    if ((ph->conf).connection_timeout != 0) {
      proxy_log(ph,LOG_LEVEL_WARN,"ConnectionTimeout is not supported this version of OpenELP\n");
    }
    iVar1 = 0;
    if (((ph->conf).bind_addr_ext_add != (char **)0x0) &&
       ((__s1 = (ph->conf).bind_addr_ext, __s1 == (char *)0x0 ||
        (iVar2 = strcmp(__s1,"0.0.0.0"), iVar1 = 0, iVar2 == 0)))) {
      proxy_log(ph,LOG_LEVEL_ERROR,
                "ExternalBindAddresses must be specified if AdditionalExternalBindAddresses is used\n"
               );
      iVar1 = -0x16;
    }
  }
  return iVar1;
}

Assistant:

int proxy_load_conf(struct proxy_handle *ph, const char *path)
{
	struct proxy_priv *priv = ph->priv;
	int ret;

	ret = conf_parse_file(path, &ph->conf, &priv->log);
	if (ret < 0)
		return ret;

	if (ph->conf.connection_timeout != 0) {
		proxy_log(ph, LOG_LEVEL_WARN,
			  "ConnectionTimeout is not supported this version of OpenELP\n");
	}

	if (ph->conf.bind_addr_ext_add != NULL) {
		if (ph->conf.bind_addr_ext == NULL ||
		    strcmp(ph->conf.bind_addr_ext, "0.0.0.0") == 0) {
			proxy_log(ph, LOG_LEVEL_ERROR,
				  "ExternalBindAddresses must be specified if AdditionalExternalBindAddresses is used\n");
			return -EINVAL;
		}
	}

	return 0;
}